

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void eigensystem(double *mat,int N,double *eval,double *evec)

{
  size_t sVar1;
  ulong uVar2;
  double dVar3;
  undefined8 *__ptr;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  double *pdVar19;
  ulong uVar20;
  uint uVar21;
  size_t __nmemb;
  ulong uVar22;
  int iVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  ulong local_b0;
  
  __nmemb = (size_t)N;
  __ptr = (undefined8 *)calloc(__nmemb,8);
  memcpy(evec,mat,__nmemb * 8 * __nmemb);
  lVar4 = (__nmemb - 1) * __nmemb;
  pdVar11 = evec + lVar4;
  lVar13 = __nmemb - 2;
  pdVar12 = evec + lVar4 + 1;
  sVar17 = __nmemb;
  do {
    if ((long)sVar17 < 2) {
      *eval = 0.0;
      *__ptr = 0;
      uVar6 = 0;
      uVar10 = 0;
      pdVar11 = evec;
      pdVar12 = evec;
      if (0 < N) {
        uVar10 = (ulong)(uint)N;
      }
      for (; uVar6 != uVar10; uVar6 = uVar6 + 1) {
        if ((eval[uVar6] != 0.0) || (NAN(eval[uVar6]))) {
          pdVar15 = evec;
          for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
            dVar29 = 0.0;
            pdVar5 = pdVar15;
            for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
              dVar29 = dVar29 + pdVar12[uVar20] * *pdVar5;
              pdVar5 = pdVar5 + __nmemb;
            }
            lVar13 = 0;
            uVar20 = uVar6;
            while (bVar24 = uVar20 != 0, uVar20 = uVar20 - 1, bVar24) {
              *(double *)((long)pdVar15 + lVar13) =
                   *(double *)((long)pdVar11 + lVar13) * -dVar29 +
                   *(double *)((long)pdVar15 + lVar13);
              lVar13 = lVar13 + __nmemb * 8;
            }
            pdVar15 = pdVar15 + 1;
          }
        }
        eval[uVar6] = evec[uVar6 * __nmemb + uVar6];
        evec[uVar6 * __nmemb + uVar6] = 1.0;
        pdVar15 = pdVar11;
        for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
          pdVar12[uVar16] = 0.0;
          *pdVar15 = 0.0;
          pdVar15 = pdVar15 + __nmemb;
        }
        pdVar11 = pdVar11 + 1;
        pdVar12 = pdVar12 + __nmemb;
      }
      for (lVar13 = 1; lVar13 < (long)__nmemb; lVar13 = lVar13 + 1) {
        __ptr[lVar13 + -1] = __ptr[lVar13];
      }
      __ptr[__nmemb - 1] = 0;
      uVar21 = N - 1;
      local_b0 = 0xffffffffffffffff;
      uVar6 = 0;
LAB_00127efe:
      uVar16 = (ulong)uVar21;
      if ((int)uVar21 < (int)uVar6) {
        uVar16 = uVar6 & 0xffffffff;
      }
      if (uVar6 == uVar10) {
        free(__ptr);
        return;
      }
      uVar20 = (ulong)uVar21;
      if ((int)uVar21 < (int)uVar6) {
        uVar20 = uVar6 & 0xffffffff;
      }
      iVar23 = 0;
      uVar7 = local_b0;
LAB_00127f3c:
      uVar22 = uVar20;
      if (uVar7 - uVar16 != -1) break;
      goto LAB_00127f88;
    }
    sVar1 = sVar17 - 1;
    pdVar15 = evec + sVar1 * __nmemb;
    if (sVar17 == 2) {
LAB_00127b46:
      __ptr[sVar1] = *pdVar15;
      dVar30 = 0.0;
    }
    else {
      lVar4 = sVar17 - 2;
      dVar29 = 0.0;
      for (lVar8 = 0; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
        dVar29 = dVar29 + ABS(pdVar11[lVar8]);
      }
      if ((dVar29 == 0.0) && (!NAN(dVar29))) {
        pdVar15 = pdVar15 + lVar4;
        goto LAB_00127b46;
      }
      dVar30 = 0.0;
      for (lVar8 = 0; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
        dVar25 = pdVar11[lVar8] / dVar29;
        pdVar11[lVar8] = dVar25;
        dVar30 = dVar30 + dVar25 * dVar25;
      }
      dVar25 = pdVar15[sVar17 - 2];
      if (dVar30 < 0.0) {
        dVar26 = sqrt(dVar30);
      }
      else {
        dVar26 = SQRT(dVar30);
      }
      dVar28 = 0.0;
      dVar26 = (double)(~-(ulong)(dVar25 < 0.0) & (ulong)-dVar26 |
                       -(ulong)(dVar25 < 0.0) & (ulong)dVar26);
      __ptr[sVar1] = dVar29 * dVar26;
      dVar30 = dVar30 - dVar25 * dVar26;
      pdVar15[sVar17 - 2] = dVar25 - dVar26;
      lVar4 = 1;
      pdVar5 = evec + __nmemb;
      pdVar9 = pdVar12;
      lVar8 = lVar13;
      pdVar14 = evec;
      for (sVar17 = 0; sVar17 != sVar1; sVar17 = sVar17 + 1) {
        evec[sVar1 + sVar17 * __nmemb] = pdVar15[sVar17] / dVar30;
        dVar29 = 0.0;
        for (lVar18 = 0; lVar4 != lVar18; lVar18 = lVar18 + 1) {
          dVar29 = dVar29 + pdVar14[lVar18] * pdVar11[lVar18];
        }
        pdVar19 = pdVar5;
        for (lVar18 = 0; lVar8 != lVar18; lVar18 = lVar18 + 1) {
          dVar29 = dVar29 + *pdVar19 * pdVar9[lVar18];
          pdVar19 = pdVar19 + __nmemb;
        }
        __ptr[sVar17] = dVar29 / dVar30;
        dVar28 = dVar28 + (dVar29 / dVar30) * pdVar15[sVar17];
        lVar4 = lVar4 + 1;
        pdVar14 = pdVar14 + __nmemb;
        lVar8 = lVar8 + -1;
        pdVar9 = pdVar9 + 1;
        pdVar5 = pdVar5 + __nmemb + 1;
      }
      lVar4 = 1;
      pdVar5 = evec;
      for (sVar17 = 0; sVar17 != sVar1; sVar17 = sVar17 + 1) {
        dVar29 = pdVar15[sVar17];
        dVar25 = (-dVar28 / (dVar30 + dVar30)) * dVar29 + (double)__ptr[sVar17];
        __ptr[sVar17] = dVar25;
        for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
          pdVar5[lVar8] = pdVar5[lVar8] - ((double)__ptr[lVar8] * dVar29 + pdVar11[lVar8] * dVar25);
        }
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + __nmemb;
      }
    }
    eval[sVar1] = dVar30;
    pdVar11 = pdVar11 + -__nmemb;
    lVar13 = lVar13 + -1;
    pdVar12 = pdVar12 + -__nmemb;
    sVar17 = sVar1;
  } while( true );
  dVar29 = ABS(eval[uVar7 + 2]) + ABS(eval[uVar7 + 1]);
  lVar13 = uVar7 + 1;
  uVar7 = uVar7 + 1;
  if ((ABS((double)__ptr[lVar13]) + dVar29 != dVar29) ||
     (NAN(ABS((double)__ptr[lVar13]) + dVar29) || NAN(dVar29))) goto LAB_00127f3c;
  uVar22 = uVar7 & 0xffffffff;
LAB_00127f88:
  if (uVar22 != uVar6) {
    if (iVar23 == 0x1e) {
      printf("Too many iterations in tqli");
    }
    iVar23 = iVar23 + 1;
    dVar29 = eval[uVar6];
    dVar30 = (double)__ptr[uVar6];
    dVar25 = (eval[uVar6 + 1] - dVar29) / (dVar30 + dVar30);
    dVar26 = pythag(dVar25,1.0);
    dVar28 = 0.0;
    dVar30 = dVar30 / ((double)(~-(ulong)(dVar25 < 0.0) & (ulong)ABS(dVar26) |
                               ((ulong)dVar26 | (ulong)DAT_00153740) & -(ulong)(dVar25 < 0.0)) +
                      dVar25) + (eval[uVar22] - dVar29);
    pdVar11 = evec + (uVar22 - 1);
    lVar13 = uVar22 << 0x20;
    dVar25 = 1.0;
    dVar29 = 1.0;
    uVar7 = uVar22;
    while ((long)uVar6 < (long)uVar7) {
      uVar2 = uVar7 - 1;
      dVar26 = (double)__ptr[uVar2];
      dVar29 = dVar29 * dVar26;
      dVar27 = pythag(dVar29,dVar30);
      __ptr[uVar7] = dVar27;
      if ((dVar27 == 0.0) && (!NAN(dVar27))) {
        eval[uVar7] = eval[uVar7] - dVar28;
        goto LAB_00128200;
      }
      dVar26 = dVar25 * dVar26;
      dVar29 = dVar29 / dVar27;
      dVar25 = dVar30 / dVar27;
      dVar30 = eval[uVar7] - dVar28;
      dVar27 = (eval[uVar2] - dVar30) * dVar29 + (dVar25 + dVar25) * dVar26;
      dVar28 = dVar29 * dVar27;
      eval[uVar7] = dVar30 + dVar28;
      uVar7 = (ulong)(uint)N;
      lVar4 = lVar13;
      pdVar12 = pdVar11;
      while (bVar24 = uVar7 != 0, uVar7 = uVar7 - 1, bVar24) {
        dVar30 = *(double *)((long)evec + (lVar4 >> 0x1d));
        dVar3 = *pdVar12;
        *(double *)((long)evec + (lVar4 >> 0x1d)) = dVar29 * dVar3 + dVar25 * dVar30;
        *pdVar12 = dVar3 * dVar25 + dVar30 * -dVar29;
        pdVar12 = pdVar12 + __nmemb;
        lVar4 = lVar4 + (__nmemb << 0x20);
      }
      dVar30 = dVar27 * dVar25 - dVar26;
      pdVar11 = pdVar11 + -1;
      lVar13 = lVar13 + -0x100000000;
      uVar7 = uVar2;
    }
    eval[uVar6] = eval[uVar6] - dVar28;
    __ptr[uVar6] = dVar30;
LAB_00128200:
    __ptr[uVar22] = 0;
    uVar7 = local_b0;
    goto LAB_00127f3c;
  }
  uVar6 = uVar6 + 1;
  local_b0 = local_b0 + 1;
  goto LAB_00127efe;
}

Assistant:

void eigensystem(double *mat, int N, double *eval, double *evec) {
	double *e;

	e = (double*)calloc(N, sizeof(double));

	memcpy(evec, mat, sizeof(double)*N*N);

	tred2(evec, N, eval, e);
	tqli(eval, N, e, evec);

	free(e);
}